

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf_test.cc
# Opt level: O0

void __thiscall PBKDFTest_EmptySalt_Test::~PBKDFTest_EmptySalt_Test(PBKDFTest_EmptySalt_Test *this)

{
  PBKDFTest_EmptySalt_Test *this_local;
  
  ~PBKDFTest_EmptySalt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PBKDFTest, EmptySalt) {
  const uint8_t kKey[] = {0x8b, 0xc2, 0xf9, 0x16, 0x7a, 0x81, 0xcd, 0xcf,
                          0xad, 0x12, 0x35, 0xcd, 0x90, 0x47, 0xf1, 0x13,
                          0x62, 0x71, 0xc1, 0xf9, 0x78, 0xfc, 0xfc, 0xb3,
                          0x5e, 0x22, 0xdb, 0xea, 0xfa, 0x46, 0x34, 0xf6};
  uint8_t key[sizeof(kKey)];

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("password", 8, NULL, 0, 2, EVP_sha256(),
                                sizeof(kKey), key));
  EXPECT_EQ(Bytes(kKey), Bytes(key));

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("password", 8, (const uint8_t *)"", 0, 2,
                                EVP_sha256(), sizeof(kKey), key));
  EXPECT_EQ(Bytes(kKey), Bytes(key));
}